

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_rc_regulate_q(AV1_COMP *cpi,int target_bits_per_frame,int active_best_quality,
                     int active_worst_quality,int width,int height)

{
  int iVar1;
  int iVar2;
  AV1_COMP *in_RDI;
  int in_R8D;
  int in_R9D;
  int q;
  int target_bits_per_mb;
  double correction_factor;
  int MBs;
  AV1_COMP *in_stack_00000030;
  int in_stack_000000d0;
  int in_stack_000000d4;
  int in_stack_000000d8;
  int in_stack_000000dc;
  AV1_COMP *in_stack_000000e0;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  av1_get_MBs(in_R8D,in_R9D);
  get_rate_correction_factor(in_stack_00000030,cpi._4_4_,(int)cpi);
  iVar1 = find_closest_qindex_by_rate
                    (height,(AV1_COMP *)correction_factor,_q,in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8);
  if (((in_RDI->oxcf).rc_cfg.mode == AOM_CBR) && (iVar2 = has_no_stats_stage(in_RDI), iVar2 != 0)) {
    iVar1 = adjust_q_cbr(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d4,
                         in_stack_000000d0);
  }
  return iVar1;
}

Assistant:

int av1_rc_regulate_q(const AV1_COMP *cpi, int target_bits_per_frame,
                      int active_best_quality, int active_worst_quality,
                      int width, int height) {
  const int MBs = av1_get_MBs(width, height);
  const double correction_factor =
      get_rate_correction_factor(cpi, width, height);
  const int target_bits_per_mb =
      (int)(((uint64_t)target_bits_per_frame << BPER_MB_NORMBITS) / MBs);

  int q =
      find_closest_qindex_by_rate(target_bits_per_mb, cpi, correction_factor,
                                  active_best_quality, active_worst_quality);
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && has_no_stats_stage(cpi))
    return adjust_q_cbr(cpi, q, active_worst_quality, width, height);

  return q;
}